

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O3

DWORD __thiscall FNodeBuilder::CheckLoopEnd(FNodeBuilder *this,fixed_t dx,fixed_t dy,int vertex)

{
  FSimpleVert FVar1;
  FPrivVert *pFVar2;
  FPrivSeg *pFVar3;
  angle_t aVar4;
  angle_t aVar5;
  uint uVar6;
  FPrivVert *pFVar7;
  DWORD DVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double l;
  DWORD local_5c;
  
  pFVar7 = (this->Vertices).Array;
  aVar4 = PointToAngle(dx,dy);
  DVar8 = pFVar7[vertex].segs;
  if (DVar8 == 0xffffffff) {
LAB_003aaa8d:
    DVar8 = 0xffffffff;
  }
  else {
    pFVar7 = pFVar7 + vertex;
    dVar10 = (double)dy;
    dVar12 = (double)dx;
    uVar9 = 0xffffffff;
    local_5c = 0xffffffff;
    do {
      pFVar2 = (this->Vertices).Array;
      pFVar3 = (this->Segs).Array + DVar8;
      aVar5 = PointToAngle(pFVar2[pFVar3->v2].super_FSimpleVert.x - (pFVar7->super_FSimpleVert).x,
                           pFVar2[pFVar3->v2].super_FSimpleVert.y - (pFVar7->super_FSimpleVert).y);
      uVar6 = aVar5 - (aVar4 + 0x80000000);
      if ((((4999 < uVar6) ||
           (FVar1 = (this->Vertices).Array[pFVar3->v1].super_FSimpleVert,
           dVar11 = ((double)(pFVar7->super_FSimpleVert).y - (double)FVar1.y) * dVar12 -
                    ((double)(pFVar7->super_FSimpleVert).x - (double)FVar1.x) * dVar10,
           17179869184.0 <= ABS(dVar11))) ||
          (42.94967296 <= (dVar11 * dVar11) / (dVar12 * dVar12 + dVar10 * dVar10))) &&
         (uVar6 <= uVar9)) {
        uVar9 = uVar6;
        local_5c = DVar8;
      }
      DVar8 = pFVar3->nextforvert;
    } while (DVar8 != 0xffffffff);
    DVar8 = 0xffffffff;
    if (local_5c != 0xffffffff) {
      for (uVar6 = pFVar7->segs2; DVar8 = local_5c, uVar6 != 0xffffffff;
          uVar6 = pFVar3[uVar6].nextforvert2) {
        pFVar3 = (this->Segs).Array;
        pFVar2 = (this->Vertices).Array;
        aVar5 = PointToAngle(pFVar2[pFVar3[uVar6].v1].super_FSimpleVert.x -
                             (pFVar7->super_FSimpleVert).x,
                             pFVar2[pFVar3[uVar6].v1].super_FSimpleVert.y -
                             (pFVar7->super_FSimpleVert).y);
        if ((aVar5 - (aVar4 + 0x80000000) < uVar9) && (pFVar3[uVar6].partner != local_5c))
        goto LAB_003aaa8d;
      }
    }
  }
  return DVar8;
}

Assistant:

DWORD FNodeBuilder::CheckLoopEnd (fixed_t dx, fixed_t dy, int vertex)
{
	FPrivVert *v = &Vertices[vertex];
	angle_t splitAngle = PointToAngle (dx, dy) + ANGLE_180;
	DWORD segnum;
	angle_t bestang;
	DWORD bestseg;

	// Find the seg starting at this vertex that forms the smallest angle
	// to the splitter.
	segnum = v->segs;
	bestang = ANGLE_MAX;
	bestseg = DWORD_MAX;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v2].x - v->x, Vertices[seg->v2].y - v->y);
		angle_t diff = segAngle - splitAngle;

		if (diff < ANGLE_EPSILON &&
			PointOnSide (Vertices[seg->v1].x, Vertices[seg->v1].y, v->x, v->y, dx, dy) == 0)
		{
			// If a seg lies right on the splitter, don't count it
		}
		else
		{
			if (diff <= bestang)
			{
				bestang = diff;
				bestseg = segnum;
			}
		}
		segnum = seg->nextforvert;
	}
	if (bestseg == DWORD_MAX)
	{
		return DWORD_MAX;
	}
	// Now make sure there are no segs ending at this vertex that form
	// an even smaller angle to the splitter.
	segnum = v->segs2;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v1].x - v->x, Vertices[seg->v1].y - v->y);
		angle_t diff = segAngle - splitAngle;
		if (diff < bestang && seg->partner != bestseg)
		{
			return DWORD_MAX;
		}
		segnum = seg->nextforvert2;
	}
	return bestseg;
}